

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,int initSize2,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  uint key2;
  MemoryManager *pMVar3;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *pRVar4;
  XMLSize_t initSize;
  XMLCh *key1;
  ulong local_60;
  XMLSize_t itemIndex;
  SchemaElementDecl *elemDecl;
  ulong uStack_48;
  int scopeKey;
  XMLSize_t itemNumber;
  XMLSize_t local_30;
  XMLSize_t hashModulus;
  XSerializeEngine *serEng_local;
  byte local_15;
  int initSize2_local;
  bool toAdopt_local;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> **ppRStack_10;
  int param_1_local;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> **objToLoad_local;
  
  hashModulus = (XMLSize_t)serEng;
  serEng_local._4_4_ = initSize2;
  local_15 = toAdopt;
  initSize2_local = param_2;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&local_30);
    if (*ppRStack_10 ==
        (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      pRVar4 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x40,pMVar3);
      bVar1 = local_15;
      initSize = (XMLSize_t)serEng_local._4_4_;
      pMVar3 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(pRVar4,local_30,(bool)(bVar1 & 1),initSize,pMVar3);
      *ppRStack_10 = pRVar4;
    }
    XSerializeEngine::registerObject((XSerializeEngine *)hashModulus,*ppRStack_10);
    uStack_48 = 0;
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&stack0xffffffffffffffb8);
    for (local_60 = 0; local_60 < uStack_48; local_60 = local_60 + 1) {
      XSerializeEngine::operator>>((XSerializeEngine *)hashModulus,(int *)((long)&elemDecl + 4));
      xercesc_4_0::operator>>((XSerializeEngine *)hashModulus,(SchemaElementDecl **)&itemIndex);
      pRVar4 = *ppRStack_10;
      key1 = XMLElementDecl::getBaseName((XMLElementDecl *)itemIndex);
      key2 = XMLElementDecl::getURI((XMLElementDecl *)itemIndex);
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                (pRVar4,key1,key2,elemDecl._4_4_,(SchemaElementDecl *)itemIndex);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHash3KeysIdPool<SchemaElementDecl>** objToLoad
                                   , int
                                   , bool                                    toAdopt
                                   , int                                     initSize2
                                   , XSerializeEngine&                       serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHash3KeysIdPool<SchemaElementDecl>(
                                                                   hashModulus
                                                                 , toAdopt
                                                                 , initSize2
                                                                 , serEng.getMemoryManager());
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        int scopeKey;
        SchemaElementDecl*  elemDecl;
        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            serEng>>scopeKey;
            serEng>>elemDecl;

           (*objToLoad)->put(elemDecl->getBaseName()
                            , elemDecl->getURI()
                            , scopeKey
                            , elemDecl);
        }

    }

}